

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::utp_stream::
async_write_some<boost::asio::const_buffer,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux___ed_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
          (utp_stream *this,const_buffer *buffers,write_op<_113276cb_> *handler)

{
  bool bVar1;
  io_context *local_88;
  undefined4 local_7c;
  _Bind_result<_b4a6085a_> local_78;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    local_88 = this->m_io_service;
    local_78._M_f.stream_ = handler->stream_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.total_consumed_
         = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
    local_78._M_f.start_ = handler->start_;
    local_78._M_f.handler_._M_f = (handler->handler_)._M_f;
    local_78._M_f.handler_._8_8_ = *(undefined8 *)&(handler->handler_).field_0x8;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
         _M_head_impl.
         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (handler->handler_)._M_bound_args.
            super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
            .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
            _M_head_impl.
            super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    (handler->handler_)._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (handler->handler_)._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x6b;
    local_7c = 1;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_m___aceholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_88,
               (_Bind_result<_37405971_> *)&local_78);
  }
  else if ((this->m_write_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
    bVar1 = check_fin_sent(this);
    if (bVar1) {
      local_88 = this->m_io_service;
      local_78._M_f.stream_ = handler->stream_;
      local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             data_;
      local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             size_;
      local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.
      total_consumed_ =
           (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
      local_78._M_f.start_ = handler->start_;
      local_78._M_f.handler_._M_f = (handler->handler_)._M_f;
      local_78._M_f.handler_._8_8_ = *(undefined8 *)&(handler->handler_).field_0x8;
      local_78._M_f.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (handler->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
           .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
           _M_head_impl.
           super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78._M_f.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (handler->handler_)._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      (handler->handler_)._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (handler->handler_)._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)0;
      local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x20;
      local_7c = 1;
      boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
      execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_m___aceholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
                ((basic_executor_type<std::allocator<void>,0u> *)&local_88,
                 (_Bind_result<_37405971_> *)&local_78);
    }
    else {
      if (buffers->size_ != 0) {
        add_write_buffer(this,buffers->data_,(int)buffers->size_);
        if (buffers->size_ != 0) {
          ::std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                    ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                     &this->m_write_handler,handler);
          issue_write(this);
          return;
        }
      }
      local_88 = this->m_io_service;
      local_78._M_f.stream_ = handler->stream_;
      local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             data_;
      local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_
           = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.
             size_;
      local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.
      total_consumed_ =
           (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
      local_78._M_f.start_ = handler->start_;
      local_78._M_f.handler_._M_f = (handler->handler_)._M_f;
      local_78._M_f.handler_._8_8_ = *(undefined8 *)&(handler->handler_).field_0x8;
      local_78._M_f.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (handler->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
           .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
           _M_head_impl.
           super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78._M_f.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (handler->handler_)._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      (handler->handler_)._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (handler->handler_)._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)0;
      local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0;
      local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.failed_ = false;
      local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      local_7c = 1;
      boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
      execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_m___td::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code,unsigned_long)>>
                ((basic_executor_type<std::allocator<void>,0u> *)&local_88,&local_78);
    }
  }
  else {
    local_88 = this->m_io_service;
    local_78._M_f.stream_ = handler->stream_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.data_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.buffer_.size_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffer>.total_consumed_
         = (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffer>.
           total_consumed_;
    local_78._M_f.start_ = handler->start_;
    local_78._M_f.handler_._M_f = (handler->handler_)._M_f;
    local_78._M_f.handler_._8_8_ = *(undefined8 *)&(handler->handler_).field_0x8;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
         _M_head_impl.
         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (handler->handler_)._M_bound_args.
            super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
            .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
            _M_head_impl.
            super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    (handler->handler_)._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (handler->handler_)._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x5f;
    local_7c = 1;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_m___aceholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_88,
               (_Bind_result<_37405971_> *)&local_78);
  }
  if (local_78._M_f.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78._M_f.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
               .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
               _M_head_impl.
               super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler handler)
	{
		if (m_impl == nullptr)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		if (check_fin_sent())
		{
			// we can't send more data after closing the socket
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::broken_pipe, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_write_buffer(i->data(), int(i->size()));
			bytes_added += i->size();
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			post(m_io_service, std::bind<void>(std::move(handler), error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = std::move(handler);
		issue_write();
	}